

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O3

void baryonyx::info<std::basic_string_view<char,std::char_traits<char>>,bool,std::__cxx11::string>
               (context *ctx,char *fmt,basic_string_view<char,_std::char_traits<char>_> *arg1,
               bool *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  char *local_40;
  char *local_38;
  size_t local_30;
  ulong local_28;
  pointer local_18;
  size_type sStack_10;
  
  if (5 < (int)ctx->log_priority) {
    local_30 = arg1->_M_len;
    local_38 = arg1->_M_str;
    local_18 = (args_1->_M_dataplus)._M_p;
    sStack_10 = args_1->_M_string_length;
    local_28 = (ulong)*args;
    args_00.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_40;
    args_00.desc_ = (unsigned_long_long)&local_38;
    local_40 = fmt;
    ::fmt::v7::vprint<char_const*,char>
              (_stdout,(FILE *)(context::message_style + 0x78),(text_style *)&local_40,
               (char **)0xd7d,args_00);
  }
  return;
}

Assistant:

inline bool
is_loggable(context::message_type current_level, int level) noexcept
{
    return static_cast<int>(current_level) >= level;
}